

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::transfer_n_backward
          (btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           *this,size_type n,size_type dest_i,size_type src_i,
          btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          *src_node,allocator_type *alloc)

{
  template_ElementType<3UL> *ptVar1;
  template_ElementType<3UL> *ptVar2;
  long lVar3;
  
  ptVar1 = btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           ::GetField<3ul>((btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                            *)src_node);
  ptVar2 = btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           ::GetField<3ul>((btree_node<absl::lts_20240722::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                            *)this);
  for (lVar3 = n << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
    *(undefined8 *)((long)&ptVar2[dest_i - 1].first + lVar3) =
         *(undefined8 *)((long)&ptVar1[src_i - 1].first + lVar3);
  }
  return;
}

Assistant:

void transfer_n_backward(const size_type n, const size_type dest_i,
                           const size_type src_i, btree_node *src_node,
                           allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i + n), *end = src - n,
                   *dest = slot(dest_i + n);
         src != end; --src, --dest) {
      // If we modified the loop index calculations above to avoid the -1s here,
      // it would result in UB in the computation of `end` (and possibly `src`
      // as well, if n == 0), since slot() is effectively an array index and it
      // is UB to compute the address of any out-of-bounds array element except
      // for one-past-the-end.
      transfer(dest - 1, src - 1, alloc);
    }
  }